

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O0

void __thiscall PcodeOp::insertInput(PcodeOp *this,int4 slot)

{
  value_type pVVar1;
  int iVar2;
  size_type sVar3;
  reference ppVVar4;
  int local_24;
  value_type pVStack_20;
  int4 i;
  int4 local_14;
  PcodeOp *pPStack_10;
  int4 slot_local;
  PcodeOp *this_local;
  
  pVStack_20 = (value_type)0x0;
  local_14 = slot;
  pPStack_10 = this;
  std::vector<Varnode_*,_std::allocator<Varnode_*>_>::push_back
            (&this->inrefs,&stack0xffffffffffffffe0);
  sVar3 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::size(&this->inrefs);
  iVar2 = (int)sVar3;
  while (local_24 = iVar2 + -1, local_14 < local_24) {
    ppVVar4 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                        (&this->inrefs,(long)(iVar2 + -2));
    pVVar1 = *ppVVar4;
    ppVVar4 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                        (&this->inrefs,(long)local_24);
    *ppVVar4 = pVVar1;
    iVar2 = local_24;
  }
  ppVVar4 = std::vector<Varnode_*,_std::allocator<Varnode_*>_>::operator[]
                      (&this->inrefs,(long)local_14);
  *ppVVar4 = (value_type)0x0;
  return;
}

Assistant:

void PcodeOp::insertInput(int4 slot)

{
  inrefs.push_back((Varnode *)0);
  for(int4 i=inrefs.size()-1;i>slot;--i)
    inrefs[i] = inrefs[i-1];
  inrefs[slot] = (Varnode *)0;
}